

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_deserialize(sqlite3 *db,char *zSchema,uchar *pData,sqlite3_int64 szDb,
                       sqlite3_int64 szBuf,uint mFlags)

{
  undefined1 *puVar1;
  MemStore *pMVar2;
  int iVar3;
  int iVar4;
  char *zSql;
  MemFile *pMVar5;
  sqlite3_int64 sVar6;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_50;
  uint local_44;
  sqlite3_int64 local_40;
  sqlite3_int64 local_38;
  
  local_50 = (sqlite3_stmt *)0x0;
  local_40 = szDb;
  local_38 = szBuf;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (zSchema == (char *)0x0) {
    zSchema = db->aDb->zDbSName;
  }
  iVar3 = sqlite3FindDbName(db,zSchema);
  iVar4 = 1;
  if (1 < iVar3 || iVar3 == 0) {
    local_44 = mFlags;
    zSql = sqlite3_mprintf("ATTACH x AS %Q",zSchema);
    if (zSql == (char *)0x0) {
      iVar4 = 7;
    }
    else {
      iVar4 = sqlite3LockAndPrepare(db,zSql,-1,0x80,(Vdbe *)0x0,&local_50,(char **)0x0);
      sqlite3_free(zSql);
    }
    mFlags = local_44;
    if (iVar4 == 0) {
      (db->init).iDb = (u8)iVar3;
      puVar1 = &(db->init).field_0x6;
      *puVar1 = *puVar1 | 4;
      iVar3 = sqlite3_step(local_50);
      puVar1 = &(db->init).field_0x6;
      *puVar1 = *puVar1 & 0xfb;
      iVar4 = 1;
      if ((iVar3 == 0x65) &&
         (pMVar5 = memdbFromDbSchema(db,zSchema), iVar4 = 1, pMVar5 != (MemFile *)0x0)) {
        pMVar2 = pMVar5->pStore;
        pMVar2->aData = pData;
        pMVar2->sz = local_40;
        pMVar2->szAlloc = local_38;
        pMVar2->szMax = local_38;
        sVar6 = local_38;
        if (local_38 < sqlite3Config.mxMemdbSize) {
          sVar6 = sqlite3Config.mxMemdbSize;
        }
        pMVar2->szMax = sVar6;
        pMVar2->mFlags = mFlags;
        pData = (uchar *)0x0;
        iVar4 = 0;
      }
    }
  }
  sqlite3_finalize(local_50);
  if ((mFlags & 1) != 0 && pData != (uchar *)0x0) {
    sqlite3_free(pData);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar4;
}

Assistant:

SQLITE_API int sqlite3_deserialize(
  sqlite3 *db,            /* The database connection */
  const char *zSchema,    /* Which DB to reopen with the deserialization */
  unsigned char *pData,   /* The serialized database content */
  sqlite3_int64 szDb,     /* Number bytes in the deserialization */
  sqlite3_int64 szBuf,    /* Total size of buffer pData[] */
  unsigned mFlags         /* Zero or more SQLITE_DESERIALIZE_* flags */
){
  MemFile *p;
  char *zSql;
  sqlite3_stmt *pStmt = 0;
  int rc;
  int iDb;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  if( szDb<0 ) return SQLITE_MISUSE_BKPT;
  if( szBuf<0 ) return SQLITE_MISUSE_BKPT;
#endif

  sqlite3_mutex_enter(db->mutex);
  if( zSchema==0 ) zSchema = db->aDb[0].zDbSName;
  iDb = sqlite3FindDbName(db, zSchema);
  testcase( iDb==1 );
  if( iDb<2 && iDb!=0 ){
    rc = SQLITE_ERROR;
    goto end_deserialize;
  }
  zSql = sqlite3_mprintf("ATTACH x AS %Q", zSchema);
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
    sqlite3_free(zSql);
  }
  if( rc ) goto end_deserialize;
  db->init.iDb = (u8)iDb;
  db->init.reopenMemdb = 1;
  rc = sqlite3_step(pStmt);
  db->init.reopenMemdb = 0;
  if( rc!=SQLITE_DONE ){
    rc = SQLITE_ERROR;
    goto end_deserialize;
  }
  p = memdbFromDbSchema(db, zSchema);
  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    MemStore *pStore = p->pStore;
    pStore->aData = pData;
    pData = 0;
    pStore->sz = szDb;
    pStore->szAlloc = szBuf;
    pStore->szMax = szBuf;
    if( pStore->szMax<sqlite3GlobalConfig.mxMemdbSize ){
      pStore->szMax = sqlite3GlobalConfig.mxMemdbSize;
    }
    pStore->mFlags = mFlags;
    rc = SQLITE_OK;
  }

end_deserialize:
  sqlite3_finalize(pStmt);
  if( pData && (mFlags & SQLITE_DESERIALIZE_FREEONCLOSE)!=0 ){
    sqlite3_free(pData);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}